

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::CPattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,CPattern *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdPatternBitmap *pMVar2;
  MthdPatternBitmapColor *pMVar3;
  SingleMthdTest *pSVar4;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar5;
  result_type rVar6;
  Test *pTVar7;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_359;
  TestOptions *local_358;
  MthdPatternBitmap *local_350;
  MthdPatternBitmap *local_348;
  MthdPatternBitmapColor *local_340;
  MthdPatternBitmapColor *local_338;
  Test *local_330;
  Test *local_328;
  Test *local_320;
  Test *local_318;
  Test *local_310;
  Test *local_308;
  Test *local_300;
  Test *local_2f8;
  SingleMthdTest *local_2f0;
  CPattern *local_2e8;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  SingleMthdTest *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  MthdPatternBitmapColor *local_70;
  MthdPatternBitmapColor *local_68;
  MthdPatternBitmap *local_60;
  MthdPatternBitmap *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_2f0 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_158 = local_148;
  local_2e0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"nop","");
  pSVar4 = local_2f0;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_2f0,opt,(uint32_t)rVar6);
  (pSVar4->super_MthdTest).trapbit = -1;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar4->s_cls = uVar1;
  pSVar4->s_mthd = 0x100;
  pSVar4->s_stride = 4;
  pSVar4->s_num = 1;
  pSVar4->s_trapbit = -1;
  (pSVar4->name)._M_dataplus._M_p = (pointer)&(pSVar4->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar4->name,local_158,local_158 + local_150)
  ;
  (pSVar4->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_b8 = pSVar4;
  local_2f8 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"notify","");
  pTVar7 = local_2f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2f8,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_178,local_178 + local_170);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_b0 = pTVar7;
  local_300 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"pm_trigger","");
  pTVar7 = local_300;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_300,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_198,local_198 + local_190);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_a8 = pTVar7;
  local_308 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"dma_notify","");
  pTVar7 = local_308;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_308,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 1;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_1b8,local_1b8 + local_1b0);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_a0 = pTVar7;
  local_310 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"missing","");
  pTVar7 = local_310;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_310,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_1d8,local_1d8 + local_1d0);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_98 = pTVar7;
  local_318 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"format","");
  pTVar7 = local_318;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_318,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 2;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_1f8,local_1f8 + local_1f0);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034add8;
  local_90 = pTVar7;
  local_320 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"bitmap_format","");
  pTVar7 = local_320;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_320,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 3;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_218,local_218 + local_210);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a7b0;
  local_88 = pTVar7;
  local_328 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"pattern_shape","");
  pTVar7 = local_328;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_328,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 4;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_238,local_238 + local_230);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b0c0;
  local_80 = pTVar7;
  local_330 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"pattern_select","");
  pTVar7 = local_330;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_330,opt,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 5;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_258,local_258 + local_250);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b3a8;
  local_78 = pTVar7;
  local_338 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"pattern_bitmap_color_0","");
  pMVar3 = local_338;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_338,opt,(uint32_t)rVar6,&local_d8,6,(this->super_Class).cls,0x310,0);
  local_70 = pMVar3;
  local_340 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"pattern_bitmap_color_1","");
  pMVar3 = local_340;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_340,opt,(uint32_t)rVar6,&local_f8,7,(this->super_Class).cls,0x314,1);
  local_68 = pMVar3;
  local_348 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"pattern_bitmap_0","");
  pMVar2 = local_348;
  MthdPatternBitmap::MthdPatternBitmap
            (local_348,opt,(uint32_t)rVar6,&local_118,8,(this->super_Class).cls,0x318,0);
  local_60 = pMVar2;
  local_350 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"pattern_bitmap_1","");
  pMVar2 = local_350;
  MthdPatternBitmap::MthdPatternBitmap
            (local_350,opt,(uint32_t)rVar6,&local_138,9,(this->super_Class).cls,0x31c,1);
  local_58 = pMVar2;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_278 = local_268;
  local_358 = opt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"pattern_color_y8","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,local_358,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_278,local_278 + local_270);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b4a0;
  local_50 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"pattern_color_r5g6b5","");
  uVar1 = (this->super_Class).cls;
  local_2e8 = this;
  Test::Test(pTVar7,local_358,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x500;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x20;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_298,local_298 + local_290);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b598;
  local_48 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"pattern_color_r5g5b5","");
  uVar1 = (local_2e8->super_Class).cls;
  Test::Test(pTVar7,local_358,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x600;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x20;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_2b8,local_2b8 + local_2b0);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b690;
  local_40 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"pattern_color_r8g8b8","");
  uVar1 = (local_2e8->super_Class).cls;
  Test::Test(pTVar7,local_358,(uint32_t)rVar6);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x700;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x40;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_2d8,local_2d8 + local_2d0);
  pvVar5 = local_2e0;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b788;
  __l._M_len = 0x11;
  __l._M_array = &local_b8;
  local_38 = pTVar7;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_2e0,__l,&local_359);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  return pvVar5;
}

Assistant:

std::vector<SingleMthdTest *> CPattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternSelect(opt, rnd(), "pattern_select", 5, cls, 0x30c),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 6, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 7, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 8, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 9, cls, 0x31c, 1),
		new MthdPatternColorY8(opt, rnd(), "pattern_color_y8", 10, cls, 0x400, 0x10),
		new MthdPatternColorR5G6B5(opt, rnd(), "pattern_color_r5g6b5", 12, cls, 0x500, 0x20),
		new MthdPatternColorR5G5B5(opt, rnd(), "pattern_color_r5g5b5", 11, cls, 0x600, 0x20),
		new MthdPatternColorR8G8B8(opt, rnd(), "pattern_color_r8g8b8", 13, cls, 0x700, 0x40),
	};
}